

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall
dxil_spv::CFGNode::
traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header,
          anon_class_24_3_8fce9826 *op)

{
  bool bVar1;
  reference ppCVar2;
  size_type sVar3;
  CFGNode *pCStack_48;
  bool can_visit;
  CFGNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<CFGNode_*> *__range2;
  anon_class_24_3_8fce9826 *op_local;
  CFGNode *header_local;
  UnorderedSet<const_CFGNode_*> *completed_local;
  CFGNode *this_local;
  
  __end2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&this->succ);
  node = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&this->succ);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&node), bVar1) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end2);
    pCStack_48 = *ppCVar2;
    sVar3 = std::
            unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
            ::count(completed,&stack0xffffffffffffffb8);
    if (sVar3 == 0) {
      std::
      unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
      ::insert(completed,&stack0xffffffffffffffb8);
      bVar1 = dominates(header,pCStack_48);
      if ((bVar1) &&
         (bVar1 = CFGStructurizer::rewrite_invalid_loop_breaks::anon_class_24_3_8fce9826::operator()
                            (op,pCStack_48), bVar1)) {
        traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
                  (pCStack_48,completed,header,op);
      }
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CFGNode::traverse_dominated_blocks(UnorderedSet<const CFGNode *> &completed,
                                        const CFGNode &header, const Op &op) const
{
	for (auto *node : succ)
	{
		bool can_visit = completed.count(node) == 0;
		if (can_visit)
			completed.insert(node);

		if (can_visit && header.dominates(node))
		{
			if (op(node))
				node->traverse_dominated_blocks(completed, header, op);
		}
	}
}